

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_funcname_formatter<spdlog::details::scoped_padder>::format
          (source_funcname_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  memory_buf_t *pmVar2;
  long in_RSI;
  memory_buf_t *in_RDI;
  scoped_padder p;
  size_t text_size;
  scoped_padder p_1;
  scoped_padder *in_stack_ffffffffffffff40;
  scoped_padder *this_00;
  memory_buf_t *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff58;
  scoped_padder *in_stack_ffffffffffffff60;
  scoped_padder local_98;
  memory_buf_t *local_60;
  long local_20;
  padding_info *local_10;
  scoped_padder *local_8;
  
  local_20 = in_RSI;
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,(padding_info *)in_RDI,
               in_stack_ffffffffffffff48);
    scoped_padder::~scoped_padder(in_stack_ffffffffffffff40);
  }
  else {
    bVar1 = padding_info::enabled((padding_info *)&(in_RDI->super_buffer<char>).ptr_);
    if (bVar1) {
      local_60 = (memory_buf_t *)std::char_traits<char>::length((char_type *)0x19abce);
    }
    else {
      local_60 = (memory_buf_t *)0x0;
    }
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,(padding_info *)in_RDI,
               local_60);
    local_10 = *(padding_info **)(local_20 + 0x48);
    this_00 = &local_98;
    local_8 = this_00;
    local_98.padinfo_ = local_10;
    pmVar2 = (memory_buf_t *)std::char_traits<char>::length((char_type *)0x19ac4e);
    this_00->dest_ = pmVar2;
    view.size_ = (size_t)in_stack_ffffffffffffff60;
    view.data_ = in_stack_ffffffffffffff58;
    fmt_helper::append_string_view(view,in_RDI);
    scoped_padder::~scoped_padder(this_00);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(msg.source.funcname) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.funcname, dest);
    }